

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

int nifti_read_subregion_image(nifti_image *nim,int *start_index,int *region_size,void **data)

{
  int *piVar1;
  int *piVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  znzFile file;
  long lVar7;
  ulong uVar8;
  void *dataptr;
  size_t sVar9;
  long lVar10;
  long lVar11;
  int i;
  long lVar12;
  uint uVar13;
  long lVar14;
  char *__format;
  long lVar15;
  long offset;
  long local_1a0;
  long local_198;
  long local_190;
  long local_188;
  int rs [7];
  int si [7];
  uint auStack_128 [10];
  long local_100;
  long local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  int collapsed_dims [8];
  
  collapsed_dims[0] = nim->ndim;
  lVar10 = (long)collapsed_dims[0];
  uVar6 = 0;
  uVar8 = 0;
  if (0 < collapsed_dims[0]) {
    uVar6 = (ulong)(uint)collapsed_dims[0];
  }
  while (uVar8 != uVar6) {
    if ((start_index[uVar8] == 0) && (region_size[uVar8] == nim->dim[uVar8 + 1])) {
      collapsed_dims[uVar8 + 1] = -1;
      uVar8 = uVar8 + 1;
    }
    else if (region_size[uVar8] == 1) {
      collapsed_dims[uVar8 + 1] = start_index[uVar8];
      uVar8 = uVar8 + 1;
    }
    else {
      collapsed_dims[uVar8 + 1] = -2;
      uVar8 = uVar8 + 1;
    }
  }
  for (; lVar10 < 7; lVar10 = lVar10 + 1) {
    collapsed_dims[lVar10 + 1] = -1;
  }
  uVar8 = 0;
  do {
    if (uVar6 == uVar8) {
      iVar4 = nifti_read_collapsed_image(nim,collapsed_dims,data);
      return iVar4;
    }
    lVar10 = uVar8 + 1;
    uVar8 = uVar8 + 1;
  } while (collapsed_dims[lVar10] != -2);
  uVar8 = 0;
  while (uVar6 != uVar8) {
    piVar1 = region_size + uVar8;
    piVar2 = start_index + uVar8;
    lVar10 = uVar8 + 1;
    uVar8 = uVar8 + 1;
    if (nim->dim[lVar10] < *piVar1 + *piVar2) {
      if (1 < g_opts_0) {
        fwrite("region doesn\'t fit within image size\n",0x25,1,_stderr);
      }
      return -1;
    }
  }
  file = nifti_image_load_prep(nim);
  lVar7 = znztell(file);
  uVar3 = nim->nbyper;
  uVar5 = uVar3;
  for (lVar10 = 1; lVar10 != 7; lVar10 = lVar10 + 1) {
    uVar5 = uVar5 * nim->dim[lVar10];
    auStack_128[lVar10] = uVar5;
  }
  uVar5 = nim->ndim;
  lVar10 = (long)(int)uVar5;
  uVar8 = 0;
  uVar6 = 0;
  uVar13 = uVar3;
  if (0 < (int)uVar5) {
    uVar6 = (ulong)uVar5;
  }
  for (; uVar6 != uVar8; uVar8 = uVar8 + 1) {
    piVar1 = region_size + uVar8;
    uVar13 = uVar13 * *piVar1;
  }
  dataptr = *data;
  if (dataptr == (void *)0x0) {
    dataptr = malloc((long)(int)uVar13);
    *data = dataptr;
  }
  if ((dataptr == (void *)0x0) && (1 < g_opts_0)) {
    __format = "allocation of %d bytes failed\n";
    uVar8 = (ulong)uVar13;
LAB_00110fe0:
    fprintf(_stderr,__format,uVar8);
    return -1;
  }
  for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
    si[uVar8] = start_index[uVar8];
    rs[uVar8] = region_size[uVar8];
  }
  for (; lVar10 < 7; lVar10 = lVar10 + 1) {
    si[lVar10] = 0;
    rs[lVar10] = 1;
  }
  lVar14 = (long)si[6];
  local_e0 = (long)si[5];
  local_d8 = (long)si[4];
  local_d0 = (long)si[3];
  local_b8 = (long)si[2];
  local_78 = (long)si[1];
  local_100 = (long)(int)auStack_128[6];
  local_f8 = (long)(int)auStack_128[5];
  local_f0 = (long)(int)auStack_128[4];
  local_e8 = (long)(int)auStack_128[3];
  local_a0 = (long)(int)auStack_128[2];
  lVar10 = rs[6] + lVar14;
  local_1a0 = local_78 * (int)auStack_128[1] + local_b8 * local_a0 + local_d0 * local_e8 +
              local_d8 * local_f0 + local_e0 * local_f8 + lVar7 + lVar14 * local_100 +
              (long)(int)(uVar3 * si[0]);
  local_c8 = rs[5] + local_e0;
  local_c0 = rs[4] + local_d8;
  local_b0 = rs[3] + local_d0;
  local_70 = rs[2] + local_b8;
  lVar7 = rs[1] + local_78;
  iVar4 = 0;
  local_a8 = lVar10;
  do {
    if (lVar10 <= lVar14) {
      return iVar4;
    }
    local_198 = local_1a0;
    local_98 = lVar14;
    for (lVar11 = local_e0; lVar11 < local_c8; lVar11 = lVar11 + 1) {
      local_190 = local_198;
      local_90 = lVar11;
      for (lVar15 = local_d8; lVar15 < local_c0; lVar15 = lVar15 + 1) {
        local_188 = local_190;
        local_88 = lVar15;
        for (local_80 = local_d0; local_68 = local_b8, offset = local_188, local_80 < local_b0;
            local_80 = local_80 + 1) {
          for (; lVar12 = local_78, local_60 = offset, local_68 < local_70; local_68 = local_68 + 1)
          {
            for (; lVar12 < lVar7; lVar12 = lVar12 + 1) {
              znzseek(file,offset,0);
              uVar8 = (long)nim->nbyper * (long)rs[0];
              sVar9 = nifti_read_buffer(file,dataptr,uVar8,nim);
              if (((int)uVar8 != (int)sVar9) && (1 < g_opts_0)) {
                __format = "read of %d bytes failed\n";
                uVar8 = uVar8 & 0xffffffff;
                goto LAB_00110fe0;
              }
              iVar4 = iVar4 + (int)sVar9;
              dataptr = (void *)((long)dataptr + uVar8);
              offset = offset + (int)auStack_128[1];
            }
            lVar10 = local_a8;
            lVar11 = local_90;
            lVar14 = local_98;
            lVar15 = local_88;
            offset = local_60 + local_a0;
          }
          local_188 = local_188 + local_e8;
        }
        local_190 = local_190 + local_f0;
      }
      local_198 = local_198 + local_f8;
    }
    lVar14 = lVar14 + 1;
    local_1a0 = local_1a0 + local_100;
  } while( true );
}

Assistant:

int nifti_read_subregion_image( nifti_image * nim,
                                int *start_index,
                                int *region_size,
                                void ** data )
{
  znzFile fp;                   /* file to read */
  int i,j,k,l,m,n;              /* indices for dims */
  long int bytes = 0;           /* total # bytes read */
  int total_alloc_size;         /* size of buffer allocation */
  char *readptr;                /* where in *data to read next */
  int strides[7];               /* strides between dimensions */
  int collapsed_dims[8];        /* for read_collapsed_image */
  int *image_size;              /* pointer to dimensions in header */
  long int initial_offset;
  long int offset;              /* seek offset for reading current row */

  /* probably ignored, but set to ndim for consistency*/
  collapsed_dims[0] = nim->ndim;

  /* build a dims array for collapsed image read */
  for(i = 0; i < nim->ndim; i++)
    {
    /* if you take the whole extent in this dimension */
    if(start_index[i] == 0 &&
       region_size[i] == nim->dim[i+1])
      {
      collapsed_dims[i+1] = -1;
      }
    /* if you specify a single element in this dimension */
    else if(region_size[i] == 1)
      {
      collapsed_dims[i+1] = start_index[i];
      }
    else
      {
      collapsed_dims[i+1] = -2; /* sentinel value */
      }
    }
  /* fill out end of collapsed_dims */
  for(i = nim->ndim ; i < 7; i++)
    {
    collapsed_dims[i+1] = -1;
    }

  /* check to see whether collapsed read is possible */
  for(i = 1; i <= nim->ndim; i++)
    {
    if(collapsed_dims[i] == -2)
      {
      break;
      }
    }

  /* if you get through all the dimensions without hitting
  ** a subrange of size > 1, a collapsed read is possible
  */
  if(i > nim->ndim)
    {
    return nifti_read_collapsed_image(nim, collapsed_dims, data);
    }

  /* point past first element of dim, which holds nim->ndim */
  image_size = &(nim->dim[1]);

  /* check region sizes for sanity */
  for(i = 0; i < nim->ndim; i++)
    {
    if(start_index[i]  + region_size[i] > image_size[i])
      {
      if(g_opts.debug > 1)
        {
        fprintf(stderr,"region doesn't fit within image size\n");
        }
      return -1;
      }
    }

  /* get the file open */
  fp = nifti_image_load_prep( nim );
  /* the current offset is just past the nifti header, save
   * location so that SEEK_SET can be used below
   */
  initial_offset = znztell(fp);
  /* get strides*/
  compute_strides(strides,image_size,nim->nbyper);

  total_alloc_size = nim->nbyper; /* size of pixel */

  /* find alloc size */
  for(i = 0; i < nim->ndim; i++)
    {
    total_alloc_size *= region_size[i];
    }
  /* allocate buffer, if necessary */
  if(*data == 0)
    {
    *data = (void *)malloc(total_alloc_size);
    }

  if(*data == 0)
    {
    if(g_opts.debug > 1)
      {
      fprintf(stderr,"allocation of %d bytes failed\n",total_alloc_size);
      return -1;
      }
    }

  /* point to start of data buffer as char * */
  readptr = *((char **)data);
  {
  /* can't assume that start_index and region_size have any more than
  ** nim->ndim elements so make local copies, filled out to seven elements
  */
  int si[7], rs[7];
  for(i = 0; i < nim->ndim; i++)
    {
    si[i] = start_index[i];
    rs[i] = region_size[i];
    }
  for(i = nim->ndim; i < 7; i++)
    {
    si[i] = 0;
    rs[i] = 1;
    }
  /* loop through subregion and read a row at a time */
  for(i = si[6]; i < (si[6] + rs[6]); i++)
    {
    for(j = si[5]; j < (si[5] + rs[5]); j++)
      {
      for(k = si[4]; k < (si[4] + rs[4]); k++)
        {
        for(l = si[3]; l < (si[3] + rs[3]); l++)
          {
          for(m = si[2]; m < (si[2] + rs[2]); m++)
            {
            for(n = si[1]; n < (si[1] + rs[1]); n++)
              {
              int nread,read_amount;
              offset = initial_offset +
                (i * strides[6]) +
                (j * strides[5]) +
                (k * strides[4]) +
                (l * strides[3]) +
                (m * strides[2]) +
                (n * strides[1]) +
                (si[0] * strides[0]);
              znzseek(fp, offset, SEEK_SET); /* seek to current row */
              read_amount = rs[0] * nim->nbyper; /* read a row of the subregion*/
              nread = (int)nifti_read_buffer(fp, readptr, read_amount, nim);
              if(nread != read_amount)
                {
                if(g_opts.debug > 1)
                  {
                  fprintf(stderr,"read of %d bytes failed\n",read_amount);
                  return -1;
                  }
                }
              bytes += nread;
              readptr += read_amount;
              }
            }
          }
        }
      }
    }
  }
  return bytes;
}